

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree_kv_test.cc
# Opt level: O1

void kv_get_var_nentry_test(btree_kv_ops *kv_ops)

{
  _func_void_bnode_ptr_idx_t_void_ptr_void_ptr *p_Var1;
  int iVar2;
  bnode *__ptr;
  char *pcVar3;
  char *pcVar4;
  ulong uVar5;
  long lVar6;
  undefined8 auStack_c0 [13];
  undefined1 local_58 [8];
  timeval __test_begin;
  char local_32;
  char local_31 [7];
  uint8_t v_out;
  uint8_t v;
  
  gettimeofday((timeval *)local_58,(__timezone_ptr_t)0x0);
  memleak_start();
  __ptr = (bnode *)malloc(0x1010);
  __ptr->kvsize = 0;
  __ptr->flag = 0;
  __ptr->level = 0;
  __ptr->nentry = 0;
  (__ptr->field_4).data = (void *)0x0;
  __ptr->kvsize = 0x801;
  __ptr->level = 1;
  __ptr->nentry = 10;
  (__ptr->field_4).data = __ptr + 1;
  local_31[0] = 'd';
  uVar5 = 0;
  pcVar4 = (char *)(auStack_c0 + 3);
  do {
    pcVar3 = pcVar4;
    pcVar4 = pcVar3 + -0x10;
    auStack_c0[uVar5 + 3] = pcVar4;
    builtin_strncpy(pcVar3 + -0x18,"\x1d3\x10",4);
    pcVar3[-0x14] = '\0';
    pcVar3[-0x13] = '\0';
    pcVar3[-0x12] = '\0';
    pcVar3[-0x11] = '\0';
    sprintf(pcVar4,"key%d",uVar5 & 0xffffffff);
    p_Var1 = kv_ops->set_kv;
    builtin_strncpy(pcVar3 + -0x18,".3\x10",4);
    pcVar3[-0x14] = '\0';
    pcVar3[-0x13] = '\0';
    pcVar3[-0x12] = '\0';
    pcVar3[-0x11] = '\0';
    (*p_Var1)(__ptr,(idx_t)uVar5,pcVar4,local_31);
    local_31[0] = local_31[0] + '\x01';
    uVar5 = uVar5 + 1;
  } while (uVar5 != 10);
  local_31[0] = 'd';
  lVar6 = 0;
  do {
    p_Var1 = kv_ops->get_kv;
    builtin_strncpy(pcVar3 + -0x18,"X3\x10",4);
    pcVar3[-0x14] = '\0';
    pcVar3[-0x13] = '\0';
    pcVar3[-0x12] = '\0';
    pcVar3[-0x11] = '\0';
    (*p_Var1)(__ptr,(idx_t)lVar6,&__test_begin.tv_usec,&local_32);
    pcVar4 = (char *)auStack_c0[lVar6 + 3];
    builtin_strncpy(pcVar3 + -0x18,"k3\x10",4);
    pcVar3[-0x14] = '\0';
    pcVar3[-0x13] = '\0';
    pcVar3[-0x12] = '\0';
    pcVar3[-0x11] = '\0';
    iVar2 = strcmp((char *)&__test_begin.tv_usec,pcVar4);
    if (iVar2 != 0) {
      pcVar3[-0x18] = -0x70;
      pcVar3[-0x17] = '3';
      pcVar3[-0x16] = '\x10';
      pcVar3[-0x15] = '\0';
      pcVar3[-0x14] = '\0';
      pcVar3[-0x13] = '\0';
      pcVar3[-0x12] = '\0';
      pcVar3[-0x11] = '\0';
      kv_get_var_nentry_test();
    }
    if (local_32 != local_31[0]) {
      pcVar3[-0x18] = -0x61;
      pcVar3[-0x17] = '3';
      pcVar3[-0x16] = '\x10';
      pcVar3[-0x15] = '\0';
      pcVar3[-0x14] = '\0';
      pcVar3[-0x13] = '\0';
      pcVar3[-0x12] = '\0';
      pcVar3[-0x11] = '\0';
      kv_get_var_nentry_test();
    }
    local_31[0] = local_31[0] + '\x01';
    lVar6 = lVar6 + 1;
  } while (lVar6 != 10);
  pcVar3[-0x18] = -0x57;
  pcVar3[-0x17] = '3';
  pcVar3[-0x16] = '\x10';
  pcVar3[-0x15] = '\0';
  pcVar3[-0x14] = '\0';
  pcVar3[-0x13] = '\0';
  pcVar3[-0x12] = '\0';
  pcVar3[-0x11] = '\0';
  free(__ptr);
  pcVar3[-0x18] = -0x52;
  pcVar3[-0x17] = '3';
  pcVar3[-0x16] = '\x10';
  pcVar3[-0x15] = '\0';
  pcVar3[-0x14] = '\0';
  pcVar3[-0x13] = '\0';
  pcVar3[-0x12] = '\0';
  pcVar3[-0x11] = '\0';
  memleak_end();
  pcVar4 = "%s PASSED\n";
  if (kv_get_var_nentry_test(btree_kv_ops*)::__test_pass != '\0') {
    pcVar4 = "%s FAILED\n";
  }
  pcVar3[-0x18] = -0x21;
  pcVar3[-0x17] = '3';
  pcVar3[-0x16] = '\x10';
  pcVar3[-0x15] = '\0';
  pcVar3[-0x14] = '\0';
  pcVar3[-0x13] = '\0';
  pcVar3[-0x12] = '\0';
  pcVar3[-0x11] = '\0';
  fprintf(_stderr,pcVar4,"kv_get_var_nentry_test");
  return;
}

Assistant:

void kv_get_var_nentry_test(btree_kv_ops *kv_ops)
{
    TEST_INIT();
    memleak_start();

    bnoderef node;
    uint8_t v, v_out;
    idx_t idx;
    int n = 10;
    uint8_t ksize = 8;
    uint8_t vsize = sizeof(v);
    char **key = alca(char*, n);
    char *k_out = alca(char, ksize);


    node = dummy_node(ksize, vsize, 1);
    node->nentry = n;

    v = 100;

    // set n keys
    for (idx = 0; idx < n; idx ++){
        key[idx] = alca(char, ksize);
        sprintf(key[idx], "key%d", idx);
        kv_ops->set_kv(node, idx, key[idx], (void *)&v);
        v++;
    }

    // get n keys
    v = 100;
    for (idx = 0; idx < n; idx ++){
        kv_ops->get_kv(node, idx, k_out, (void *)&v_out);
        TEST_CHK(!(strcmp(k_out, key[idx])));
        TEST_CHK(v_out == v);
        v++;
    }

    free(node);
    memleak_end();
    TEST_RESULT("kv_get_var_nentry_test");
}